

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O2

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  BYTE *d;
  long *plVar5;
  char *pcVar6;
  ulong uVar7;
  long *plVar8;
  char cVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  char cVar16;
  BYTE *e_3;
  BYTE *pBVar17;
  long *plVar18;
  long *plVar19;
  int *piVar20;
  LZ4_stream_t_internal *streamPtr;
  long *plVar21;
  ulong uVar22;
  ulong uVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  size_t sVar26;
  ulong uVar27;
  BYTE *s;
  long lVar28;
  BYTE *e_1;
  int *piVar29;
  long lVar30;
  U32 *hashTable;
  BYTE *e;
  BYTE *pBVar31;
  char *local_a8;
  char *local_a0;
  char *local_70;
  U32 *hashTable_21;
  
  if ((LZ4_stream->internal_donotuse).initCheck != 0) {
    return 0;
  }
  pBVar17 = (LZ4_stream->internal_donotuse).dictionary + (LZ4_stream->internal_donotuse).dictSize;
  pBVar31 = (BYTE *)source;
  if (pBVar17 < source) {
    pBVar31 = pBVar17;
  }
  if ((LZ4_stream->internal_donotuse).dictSize == 0) {
    pBVar31 = (BYTE *)source;
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,pBVar31);
  if (acceleration < 2) {
    acceleration = 1;
  }
  pBVar24 = (BYTE *)(source + inputSize);
  pBVar31 = (LZ4_stream->internal_donotuse).dictionary;
  if (pBVar24 < pBVar17 && pBVar31 < pBVar24) {
    uVar2 = (int)pBVar17 - (int)pBVar24;
    uVar3 = 0x10000;
    if (uVar2 < 0x10000) {
      uVar3 = uVar2;
    }
    uVar7 = 0;
    if (3 < uVar2) {
      uVar7 = (ulong)uVar3;
    }
    (LZ4_stream->internal_donotuse).dictSize = (uint32_t)uVar7;
    pBVar31 = pBVar17 + -uVar7;
    (LZ4_stream->internal_donotuse).dictionary = pBVar31;
  }
  uVar3 = (LZ4_stream->internal_donotuse).dictSize;
  uVar7 = (ulong)uVar3;
  if (pBVar17 == (BYTE *)source) {
    plVar18 = (long *)source;
    pcVar6 = dest;
    if (uVar3 < 0x10000) {
      uVar2 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar2 <= uVar3) goto LAB_0010743a;
      if (0x7e000000 < (uint)inputSize) goto LAB_00107450;
      if (0xc < (uint)inputSize) {
        piVar29 = (int *)(source + -uVar7);
        lVar30 = (long)source - (ulong)uVar2;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar2;
        local_a8 = dest;
        do {
          uVar7 = 1;
          lVar28 = *(long *)((long)plVar18 + 1);
          plVar8 = (long *)((long)plVar18 + 1);
          uVar3 = acceleration << 6;
          while( true ) {
            plVar19 = (long *)(uVar7 + (long)plVar8);
            pcVar6 = local_a8;
            if (pBVar24 + -0xc < plVar19) goto LAB_00107f3b;
            uVar27 = (ulong)(lVar28 * -0x30e4432345000000) >> 0x34;
            uVar7 = (ulong)*(uint *)((long)LZ4_stream + uVar27 * 4);
            lVar28 = *plVar19;
            iVar10 = (int)plVar8;
            iVar12 = (int)lVar30;
            *(int *)((long)LZ4_stream + uVar27 * 4) = iVar10 - iVar12;
            if (((piVar29 <= (int *)(lVar30 + uVar7)) &&
                (plVar8 <= (long *)(lVar30 + uVar7 + 0xffff))) &&
               (*(int *)(lVar30 + uVar7) == (int)*plVar8)) break;
            uVar7 = (ulong)(uVar3 >> 6);
            uVar3 = uVar3 + 1;
            plVar8 = plVar19;
          }
          lVar28 = uVar7 - uVar2;
          lVar1 = 0;
          cVar16 = (char)plVar8 * '\x10' + (char)plVar18 * -0x10;
          do {
            cVar9 = cVar16;
            lVar15 = lVar1;
            piVar20 = (int *)(source + lVar15 + lVar28);
            plVar19 = (long *)((long)plVar8 + lVar15);
            if ((piVar20 <= piVar29) || (plVar19 <= plVar18)) break;
            lVar1 = lVar15 + -1;
            cVar16 = cVar9 + -0x10;
          } while (*(char *)((long)plVar8 + lVar15 + -1) == source[lVar15 + lVar28 + -1]);
          uVar3 = iVar10 - (int)plVar18;
          uVar27 = (ulong)(uVar3 + (int)lVar15);
          uVar7 = (ulong)uVar3 + lVar15;
          if (dest + maxOutputSize < local_a8 + (uVar7 & 0xffffffff) / 0xff + uVar27 + 9)
          goto LAB_00107450;
          if ((uint)uVar7 < 0xf) {
            plVar8 = (long *)(local_a8 + 1);
            *local_a8 = cVar9;
          }
          else {
            *local_a8 = -0x10;
            plVar8 = (long *)(local_a8 + 2);
            for (iVar10 = (iVar10 - (int)plVar18) + (int)lVar15 + -0xf; 0xfe < iVar10;
                iVar10 = iVar10 + -0xff) {
              *(char *)((long)plVar8 + -1) = -1;
              plVar8 = (long *)((long)plVar8 + 1);
            }
            *(char *)((long)plVar8 + -1) = (char)iVar10;
          }
          plVar5 = (long *)(uVar27 + (long)plVar8);
          do {
            *plVar8 = *plVar18;
            plVar8 = plVar8 + 1;
            plVar18 = plVar18 + 1;
          } while (plVar8 < plVar5);
          while( true ) {
            *(short *)plVar5 = (short)plVar19 - (short)piVar20;
            uVar3 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(piVar20 + 1),pBVar24 + -5);
            if (dest + maxOutputSize < (char *)((long)plVar5 + (ulong)(uVar3 >> 8) + 8))
            goto LAB_00107450;
            pcVar6 = (char *)((long)plVar5 + 2);
            if (uVar3 < 0xf) {
              *local_a8 = *local_a8 + (char)uVar3;
            }
            else {
              *local_a8 = *local_a8 + '\x0f';
              pcVar6[0] = -1;
              pcVar6[1] = -1;
              pcVar6[2] = -1;
              pcVar6[3] = -1;
              lVar28 = 0;
              for (uVar13 = uVar3 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
                pcVar6 = (char *)((long)plVar5 + lVar28 + 6);
                pcVar6[0] = -1;
                pcVar6[1] = -1;
                pcVar6[2] = -1;
                pcVar6[3] = -1;
                lVar28 = lVar28 + 4;
              }
              lVar1 = lVar28 + ((ulong)uVar13 & 0xffff) / 0xff;
              pcVar6 = (char *)((long)plVar5 + lVar1 + 3);
              *(char *)((long)plVar5 + lVar1 + 2) =
                   (char)lVar28 + (char)((ushort)uVar13 / 0xff) + (char)uVar3 + -0xf;
            }
            plVar18 = (long *)((long)plVar19 + (ulong)(uVar3 + 4));
            if (pBVar24 + -0xc < plVar18) goto LAB_00107f3b;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)((long)plVar18 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)plVar18 + -2) - iVar12;
            uVar7 = (ulong)(*plVar18 * -0x30e4432345000000) >> 0x34;
            uVar27 = (ulong)*(uint *)((long)LZ4_stream + uVar7 * 4);
            piVar20 = (int *)(lVar30 + uVar27);
            *(int *)((long)LZ4_stream + uVar7 * 4) = (int)plVar18 - iVar12;
            local_a8 = pcVar6;
            if (((piVar20 < piVar29) || ((long *)(lVar30 + uVar27 + 0xffff) < plVar18)) ||
               (*piVar20 != (int)*plVar18)) break;
            plVar5 = (long *)(pcVar6 + 1);
            *pcVar6 = '\0';
            plVar19 = plVar18;
          }
        } while( true );
      }
LAB_00107f3b:
      sVar26 = (long)pBVar24 - (long)plVar18;
      iVar12 = 0;
      if (pcVar6 + (sVar26 + 0xf0) / 0xff + (sVar26 - (long)dest) + 1 <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (sVar26 < 0xf) {
          *pcVar6 = (char)sVar26 << 4;
        }
        else {
          *pcVar6 = -0x10;
          for (uVar7 = sVar26 - 0xf; pcVar6 = pcVar6 + 1, 0xfe < uVar7; uVar7 = uVar7 - 0xff) {
            *pcVar6 = -1;
          }
          *pcVar6 = (char)uVar7;
        }
        goto LAB_00107fd3;
      }
    }
    else {
LAB_0010743a:
      if ((uint)inputSize < 0x7e000001) {
        if (0xc < (uint)inputSize) {
          uVar3 = (LZ4_stream->internal_donotuse).currentOffset;
          lVar30 = (long)source - (ulong)uVar3;
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar3;
          do {
            uVar27 = 1;
            lVar28 = *(long *)((long)plVar18 + 1);
            plVar8 = (long *)((long)plVar18 + 1);
            uVar2 = acceleration << 6;
            while( true ) {
              plVar19 = (long *)(uVar27 + (long)plVar8);
              if (pBVar24 + -0xc < plVar19) goto LAB_00107b50;
              uVar14 = (ulong)(lVar28 * -0x30e4432345000000) >> 0x34;
              uVar27 = (ulong)*(uint *)((long)LZ4_stream + uVar14 * 4);
              lVar28 = *plVar19;
              iVar10 = (int)plVar8;
              iVar12 = (int)lVar30;
              *(int *)((long)LZ4_stream + uVar14 * 4) = iVar10 - iVar12;
              if ((plVar8 <= (long *)(uVar27 + lVar30 + 0xffff)) &&
                 (*(int *)(uVar27 + lVar30) == (int)*plVar8)) break;
              uVar27 = (ulong)(uVar2 >> 6);
              uVar2 = uVar2 + 1;
              plVar8 = plVar19;
            }
            lVar28 = uVar27 - uVar3;
            lVar1 = 0;
            cVar16 = (char)plVar8 * '\x10' + (char)plVar18 * -0x10;
            do {
              cVar9 = cVar16;
              lVar15 = lVar1;
              piVar29 = (int *)(source + lVar15 + lVar28);
              plVar19 = (long *)((long)plVar8 + lVar15);
              if ((piVar29 <= source + -uVar7) || (plVar19 <= plVar18)) break;
              lVar1 = lVar15 + -1;
              cVar16 = cVar9 + -0x10;
            } while (*(char *)((long)plVar8 + lVar15 + -1) == source[lVar15 + lVar28 + -1]);
            uVar2 = iVar10 - (int)plVar18;
            uVar14 = (ulong)(uVar2 + (int)lVar15);
            uVar27 = (ulong)uVar2 + lVar15;
            if (dest + maxOutputSize < pcVar6 + (uVar27 & 0xffffffff) / 0xff + uVar14 + 9)
            goto LAB_00107450;
            if ((uint)uVar27 < 0xf) {
              plVar8 = (long *)(pcVar6 + 1);
              *pcVar6 = cVar9;
            }
            else {
              *pcVar6 = -0x10;
              plVar8 = (long *)(pcVar6 + 2);
              for (iVar10 = (iVar10 - (int)plVar18) + (int)lVar15 + -0xf; 0xfe < iVar10;
                  iVar10 = iVar10 + -0xff) {
                *(char *)((long)plVar8 + -1) = -1;
                plVar8 = (long *)((long)plVar8 + 1);
              }
              *(char *)((long)plVar8 + -1) = (char)iVar10;
            }
            plVar5 = (long *)(uVar14 + (long)plVar8);
            do {
              *plVar8 = *plVar18;
              plVar8 = plVar8 + 1;
              plVar18 = plVar18 + 1;
            } while (plVar8 < plVar5);
            while( true ) {
              *(short *)plVar5 = (short)plVar19 - (short)piVar29;
              uVar2 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(piVar29 + 1),pBVar24 + -5);
              if (dest + maxOutputSize < (char *)((long)plVar5 + (ulong)(uVar2 >> 8) + 8))
              goto LAB_00107450;
              pcVar11 = (char *)((long)plVar5 + 2);
              if (uVar2 < 0xf) {
                *pcVar6 = *pcVar6 + (char)uVar2;
              }
              else {
                *pcVar6 = *pcVar6 + '\x0f';
                pcVar11[0] = -1;
                pcVar11[1] = -1;
                pcVar11[2] = -1;
                pcVar11[3] = -1;
                lVar28 = 0;
                for (uVar13 = uVar2 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
                  pcVar6 = (char *)((long)plVar5 + lVar28 + 6);
                  pcVar6[0] = -1;
                  pcVar6[1] = -1;
                  pcVar6[2] = -1;
                  pcVar6[3] = -1;
                  lVar28 = lVar28 + 4;
                }
                lVar1 = lVar28 + ((ulong)uVar13 & 0xffff) / 0xff;
                pcVar11 = (char *)((long)plVar5 + lVar1 + 3);
                *(char *)((long)plVar5 + lVar1 + 2) =
                     (char)lVar28 + (char)((ushort)uVar13 / 0xff) + (char)uVar2 + -0xf;
              }
              plVar19 = (long *)((long)plVar19 + (ulong)(uVar2 + 4));
              plVar18 = plVar19;
              pcVar6 = pcVar11;
              if (pBVar24 + -0xc < plVar19) goto LAB_00107b50;
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)((long)plVar19 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)plVar19 + -2) - iVar12;
              uVar27 = (ulong)(*plVar19 * -0x30e4432345000000) >> 0x34;
              uVar14 = (ulong)*(uint *)((long)LZ4_stream + uVar27 * 4);
              piVar29 = (int *)(uVar14 + lVar30);
              *(int *)((long)LZ4_stream + uVar27 * 4) = (int)plVar19 - iVar12;
              if (((long *)(uVar14 + lVar30 + 0xffff) < plVar19) || (*piVar29 != (int)*plVar19))
              break;
              plVar5 = (long *)(pcVar11 + 1);
              *pcVar11 = '\0';
            }
          } while( true );
        }
LAB_00107b50:
        sVar26 = (long)pBVar24 - (long)plVar18;
        iVar12 = 0;
        if (pcVar6 + (sVar26 + 0xf0) / 0xff + (sVar26 - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (sVar26 < 0xf) {
            *pcVar6 = (char)sVar26 << 4;
          }
          else {
            *pcVar6 = -0x10;
            for (uVar7 = sVar26 - 0xf; pcVar6 = pcVar6 + 1, 0xfe < uVar7; uVar7 = uVar7 - 0xff) {
              *pcVar6 = -1;
            }
            *pcVar6 = (char)uVar7;
          }
LAB_00107fd3:
          memcpy(pcVar6 + 1,plVar18,sVar26);
          iVar12 = ((int)(pcVar6 + 1) + (int)sVar26) - (int)dest;
        }
      }
      else {
LAB_00107450:
        iVar12 = 0;
      }
    }
    uVar4 = (LZ4_stream->internal_donotuse).dictSize + inputSize;
    goto LAB_00107ff0;
  }
  plVar18 = (long *)source;
  pcVar6 = dest;
  if (uVar3 < 0x10000) {
    uVar2 = (LZ4_stream->internal_donotuse).currentOffset;
    uVar27 = (ulong)uVar2;
    if (uVar2 <= uVar3) goto LAB_001073f4;
    if (0x7e000000 < (uint)inputSize) goto LAB_00107406;
    if (0xc < (uint)inputSize) {
      plVar8 = (long *)(pBVar24 + -5);
      lVar30 = (long)source - uVar27;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar2;
      plVar19 = (long *)source;
      local_a0 = dest;
LAB_001070c6:
      uVar14 = 1;
      lVar28 = *(long *)((long)plVar19 + 1);
      plVar5 = (long *)((long)plVar19 + 1);
      uVar3 = acceleration << 6;
      do {
        plVar21 = (long *)(uVar14 + (long)plVar5);
        plVar18 = plVar19;
        pcVar6 = local_a0;
        if (pBVar24 + -0xc < plVar21) break;
        uVar23 = (ulong)(lVar28 * -0x30e4432345000000) >> 0x34;
        uVar14 = (ulong)*(uint *)((long)LZ4_stream + uVar23 * 4);
        pcVar6 = (char *)(uVar14 + lVar30);
        lVar28 = *plVar21;
        iVar12 = (int)plVar5;
        iVar10 = (int)lVar30;
        *(int *)((long)LZ4_stream + uVar23 * 4) = iVar12 - iVar10;
        if ((source + -uVar7 <= pcVar6) && (plVar5 <= (long *)(uVar14 + lVar30 + 0xffff))) {
          pBVar17 = (BYTE *)0x0;
          if (pcVar6 < source) {
            pBVar17 = pBVar31 + (uVar7 - (long)source);
          }
          if (*(int *)(pcVar6 + (long)pBVar17) == (int)*plVar5) goto LAB_00107137;
        }
        uVar14 = (ulong)(uVar3 >> 6);
        uVar3 = uVar3 + 1;
        plVar5 = plVar21;
      } while( true );
    }
LAB_00107bdc:
    sVar26 = (long)pBVar24 - (long)plVar18;
    iVar12 = 0;
    if (pcVar6 + (sVar26 + 0xf0) / 0xff + (sVar26 - (long)dest) + 1 <=
        (char *)(ulong)(uint)maxOutputSize) {
      if (sVar26 < 0xf) {
        *pcVar6 = (char)sVar26 << 4;
      }
      else {
        *pcVar6 = -0x10;
        for (uVar7 = sVar26 - 0xf; pcVar6 = pcVar6 + 1, 0xfe < uVar7; uVar7 = uVar7 - 0xff) {
          *pcVar6 = -1;
        }
        *pcVar6 = (char)uVar7;
      }
      goto LAB_00107fa5;
    }
  }
  else {
LAB_001073f4:
    if ((uint)inputSize < 0x7e000001) {
      if (0xc < (uint)inputSize) {
        plVar8 = (long *)(pBVar24 + -5);
        uVar27 = (ulong)(LZ4_stream->internal_donotuse).currentOffset;
        lVar30 = (long)source - uVar27;
        *(uint32_t *)
         ((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             (LZ4_stream->internal_donotuse).currentOffset;
        plVar19 = (long *)source;
        local_70 = dest;
LAB_001074db:
        lVar28 = *(long *)((long)plVar19 + 1);
        uVar14 = 1;
        plVar5 = (long *)((long)plVar19 + 1);
        uVar3 = acceleration << 6;
        do {
          plVar21 = (long *)(uVar14 + (long)plVar5);
          plVar18 = plVar19;
          pcVar6 = local_70;
          if (pBVar24 + -0xc < plVar21) break;
          uVar23 = (ulong)(lVar28 * -0x30e4432345000000) >> 0x34;
          uVar14 = (ulong)*(uint *)((long)LZ4_stream + uVar23 * 4);
          lVar28 = *plVar21;
          iVar12 = (int)plVar5;
          iVar10 = (int)lVar30;
          *(int *)((long)LZ4_stream + uVar23 * 4) = iVar12 - iVar10;
          if (plVar5 <= (long *)(uVar14 + lVar30 + 0xffff)) {
            pcVar6 = (char *)(uVar14 + lVar30);
            pBVar17 = (BYTE *)0x0;
            if (pcVar6 < source) {
              pBVar17 = pBVar31 + (uVar7 - (long)source);
            }
            if (*(int *)(pcVar6 + (long)pBVar17) == (int)*plVar5) goto LAB_0010754b;
          }
          uVar14 = (ulong)(uVar3 >> 6);
          uVar3 = uVar3 + 1;
          plVar5 = plVar21;
        } while( true );
      }
LAB_0010782b:
      sVar26 = (long)pBVar24 - (long)plVar18;
      iVar12 = 0;
      if (pcVar6 + (sVar26 + 0xf0) / 0xff + (sVar26 - (long)dest) + 1 <=
          (char *)(ulong)(uint)maxOutputSize) {
        if (sVar26 < 0xf) {
          *pcVar6 = (char)sVar26 << 4;
        }
        else {
          *pcVar6 = -0x10;
          for (uVar7 = sVar26 - 0xf; pcVar6 = pcVar6 + 1, 0xfe < uVar7; uVar7 = uVar7 - 0xff) {
            *pcVar6 = -1;
          }
          *pcVar6 = (char)uVar7;
        }
LAB_00107fa5:
        memcpy(pcVar6 + 1,plVar18,sVar26);
        iVar12 = ((int)(pcVar6 + 1) + (int)sVar26) - (int)dest;
      }
    }
    else {
LAB_00107406:
      iVar12 = 0;
    }
  }
LAB_00107fb3:
  (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
  uVar4 = inputSize;
LAB_00107ff0:
  (LZ4_stream->internal_donotuse).dictSize = uVar4;
  (LZ4_stream->internal_donotuse).currentOffset =
       (LZ4_stream->internal_donotuse).currentOffset + inputSize;
  return iVar12;
LAB_0010754b:
  pBVar25 = (BYTE *)source;
  if (pcVar6 < source) {
    pBVar25 = pBVar31;
  }
  cVar16 = (char)plVar5 * '\x10' + (char)plVar19 * -0x10;
  for (lVar28 = 0;
      ((plVar18 = (long *)((long)plVar5 + lVar28), plVar19 < plVar18 &&
       (pBVar25 < source + (long)(pBVar17 + lVar28 + (uVar14 - uVar27)))) &&
      (*(char *)((long)plVar5 + lVar28 + -1) ==
       source[(long)(pBVar17 + lVar28 + (uVar14 - uVar27) + -1)])); lVar28 = lVar28 + -1) {
    cVar16 = cVar16 + -0x10;
  }
  uVar3 = iVar12 - (int)plVar19;
  uVar23 = (ulong)(uVar3 + (int)lVar28);
  uVar22 = (ulong)uVar3 + lVar28;
  if (dest + maxOutputSize < local_70 + (uVar22 & 0xffffffff) / 0xff + uVar23 + 9)
  goto LAB_00107406;
  if ((uint)uVar22 < 0xf) {
    plVar5 = (long *)(local_70 + 1);
    *local_70 = cVar16;
  }
  else {
    *local_70 = -0x10;
    plVar5 = (long *)(local_70 + 2);
    for (iVar12 = (iVar12 - (int)plVar19) + (int)lVar28 + -0xf; 0xfe < iVar12;
        iVar12 = iVar12 + -0xff) {
      *(char *)((long)plVar5 + -1) = -1;
      plVar5 = (long *)((long)plVar5 + 1);
    }
    *(char *)((long)plVar5 + -1) = (char)iVar12;
  }
  pcVar11 = source + lVar28 + (uVar14 - uVar27);
  plVar21 = (long *)(uVar23 + (long)plVar5);
  do {
    *plVar5 = *plVar19;
    plVar5 = plVar5 + 1;
    plVar19 = plVar19 + 1;
  } while (plVar5 < plVar21);
  while( true ) {
    *(short *)plVar21 = (short)plVar18 - (short)pcVar11;
    if (pBVar25 == pBVar31) {
      plVar19 = (long *)(pBVar31 + (uVar7 - (long)(pcVar11 + (long)pBVar17)) + (long)plVar18);
      if (plVar8 < pBVar31 + (uVar7 - (long)(pcVar11 + (long)pBVar17)) + (long)plVar18) {
        plVar19 = plVar8;
      }
      uVar3 = LZ4_count((BYTE *)((long)plVar18 + 4),(BYTE *)(pcVar11 + (long)(pBVar17 + 4)),
                        (BYTE *)plVar19);
      plVar18 = (long *)((long)plVar18 + (ulong)(uVar3 + 4));
      if (plVar18 == plVar19) {
        uVar2 = LZ4_count((BYTE *)plVar19,(BYTE *)source,(BYTE *)plVar8);
        uVar3 = uVar3 + uVar2;
        plVar18 = (long *)((ulong)uVar2 + (long)plVar19);
      }
    }
    else {
      uVar3 = LZ4_count((BYTE *)((long)plVar18 + 4),(BYTE *)(pcVar11 + 4),(BYTE *)plVar8);
      plVar18 = (long *)((long)plVar18 + (ulong)(uVar3 + 4));
    }
    if (dest + maxOutputSize < (char *)((long)plVar21 + (ulong)(uVar3 >> 8) + 8)) {
      iVar12 = 0;
      goto LAB_00107fb3;
    }
    pcVar6 = (char *)((long)plVar21 + 2);
    if (uVar3 < 0xf) {
      *local_70 = *local_70 + (char)uVar3;
    }
    else {
      *local_70 = *local_70 + '\x0f';
      pcVar6[0] = -1;
      pcVar6[1] = -1;
      pcVar6[2] = -1;
      pcVar6[3] = -1;
      lVar28 = 0;
      for (uVar2 = uVar3 - 0xf; 0x3fb < uVar2; uVar2 = uVar2 - 0x3fc) {
        pcVar6 = (char *)((long)plVar21 + lVar28 + 6);
        pcVar6[0] = -1;
        pcVar6[1] = -1;
        pcVar6[2] = -1;
        pcVar6[3] = -1;
        lVar28 = lVar28 + 4;
      }
      lVar1 = lVar28 + ((ulong)uVar2 & 0xffff) / 0xff;
      pcVar6 = (char *)((long)plVar21 + lVar1 + 3);
      *(char *)((long)plVar21 + lVar1 + 2) =
           (char)lVar28 + (char)((uVar2 & 0xffff) / 0xff) + (char)uVar3 + -0xf;
    }
    if (pBVar24 + -0xc < plVar18) goto LAB_0010782b;
    *(int *)((long)LZ4_stream +
            ((ulong)(*(long *)((long)plVar18 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)plVar18 + -2) - iVar10;
    uVar14 = (ulong)(*plVar18 * -0x30e4432345000000) >> 0x34;
    uVar23 = (ulong)*(uint *)((long)LZ4_stream + uVar14 * 4);
    pcVar11 = (char *)(uVar23 + lVar30);
    pBVar25 = (BYTE *)source;
    pBVar17 = (BYTE *)0x0;
    if (pcVar11 < source) {
      pBVar25 = pBVar31;
      pBVar17 = pBVar31 + (uVar7 - (long)source);
    }
    *(int *)((long)LZ4_stream + uVar14 * 4) = (int)plVar18 - iVar10;
    plVar19 = plVar18;
    local_70 = pcVar6;
    if (((long *)(uVar23 + lVar30 + 0xffff) < plVar18) ||
       (*(int *)(pcVar11 + (long)pBVar17) != (int)*plVar18)) break;
    plVar21 = (long *)(pcVar6 + 1);
    *pcVar6 = '\0';
  }
  goto LAB_001074db;
LAB_00107137:
  pBVar25 = (BYTE *)source;
  if (pcVar6 < source) {
    pBVar25 = pBVar31;
  }
  cVar16 = (char)plVar5 * '\x10' + (char)plVar19 * -0x10;
  for (lVar28 = 0;
      ((plVar18 = (long *)((long)plVar5 + lVar28), plVar19 < plVar18 &&
       (pBVar25 < source + (long)(pBVar17 + lVar28 + (uVar14 - uVar27)))) &&
      (*(char *)((long)plVar5 + lVar28 + -1) ==
       source[(long)(pBVar17 + lVar28 + (uVar14 - uVar27) + -1)])); lVar28 = lVar28 + -1) {
    cVar16 = cVar16 + -0x10;
  }
  uVar3 = iVar12 - (int)plVar19;
  uVar22 = (ulong)(uVar3 + (int)lVar28);
  uVar23 = (ulong)uVar3 + lVar28;
  if (dest + maxOutputSize < local_a0 + (uVar23 & 0xffffffff) / 0xff + uVar22 + 9)
  goto LAB_00107406;
  if ((uint)uVar23 < 0xf) {
    plVar5 = (long *)(local_a0 + 1);
    *local_a0 = cVar16;
  }
  else {
    *local_a0 = -0x10;
    plVar5 = (long *)(local_a0 + 2);
    for (iVar12 = (iVar12 - (int)plVar19) + (int)lVar28 + -0xf; 0xfe < iVar12;
        iVar12 = iVar12 + -0xff) {
      *(char *)((long)plVar5 + -1) = -1;
      plVar5 = (long *)((long)plVar5 + 1);
    }
    *(char *)((long)plVar5 + -1) = (char)iVar12;
  }
  pcVar11 = source + lVar28 + (uVar14 - uVar27);
  plVar21 = (long *)(uVar22 + (long)plVar5);
  do {
    *plVar5 = *plVar19;
    plVar5 = plVar5 + 1;
    plVar19 = plVar19 + 1;
  } while (plVar5 < plVar21);
  while( true ) {
    *(short *)plVar21 = (short)plVar18 - (short)pcVar11;
    if (pBVar25 == pBVar31) {
      plVar19 = (long *)(pBVar31 + (uVar7 - (long)(pcVar11 + (long)pBVar17)) + (long)plVar18);
      if (plVar8 < pBVar31 + (uVar7 - (long)(pcVar11 + (long)pBVar17)) + (long)plVar18) {
        plVar19 = plVar8;
      }
      uVar3 = LZ4_count((BYTE *)((long)plVar18 + 4),(BYTE *)(pcVar11 + (long)(pBVar17 + 4)),
                        (BYTE *)plVar19);
      plVar18 = (long *)((long)plVar18 + (ulong)(uVar3 + 4));
      if (plVar18 == plVar19) {
        uVar2 = LZ4_count((BYTE *)plVar19,(BYTE *)source,(BYTE *)plVar8);
        uVar3 = uVar3 + uVar2;
        plVar18 = (long *)((ulong)uVar2 + (long)plVar19);
      }
    }
    else {
      uVar3 = LZ4_count((BYTE *)((long)plVar18 + 4),(BYTE *)(pcVar11 + 4),(BYTE *)plVar8);
      plVar18 = (long *)((long)plVar18 + (ulong)(uVar3 + 4));
    }
    if (dest + maxOutputSize < (char *)((long)plVar21 + (ulong)(uVar3 >> 8) + 8)) goto LAB_00107406;
    pcVar6 = (char *)((long)plVar21 + 2);
    if (uVar3 < 0xf) {
      *local_a0 = *local_a0 + (char)uVar3;
    }
    else {
      *local_a0 = *local_a0 + '\x0f';
      pcVar6[0] = -1;
      pcVar6[1] = -1;
      pcVar6[2] = -1;
      pcVar6[3] = -1;
      lVar28 = 0;
      for (uVar2 = uVar3 - 0xf; 0x3fb < uVar2; uVar2 = uVar2 - 0x3fc) {
        pcVar6 = (char *)((long)plVar21 + lVar28 + 6);
        pcVar6[0] = -1;
        pcVar6[1] = -1;
        pcVar6[2] = -1;
        pcVar6[3] = -1;
        lVar28 = lVar28 + 4;
      }
      lVar1 = lVar28 + ((ulong)uVar2 & 0xffff) / 0xff;
      pcVar6 = (char *)((long)plVar21 + lVar1 + 3);
      *(char *)((long)plVar21 + lVar1 + 2) =
           (char)lVar28 + (char)((uVar2 & 0xffff) / 0xff) + (char)uVar3 + -0xf;
    }
    if (pBVar24 + -0xc < plVar18) goto LAB_00107bdc;
    *(int *)((long)LZ4_stream +
            ((ulong)(*(long *)((long)plVar18 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
         ((int)plVar18 + -2) - iVar10;
    uVar14 = (ulong)(*plVar18 * -0x30e4432345000000) >> 0x34;
    uVar23 = (ulong)*(uint *)((long)LZ4_stream + uVar14 * 4);
    pcVar11 = (char *)(uVar23 + lVar30);
    pBVar25 = (BYTE *)source;
    pBVar17 = (BYTE *)0x0;
    if (pcVar11 < source) {
      pBVar25 = pBVar31;
      pBVar17 = pBVar31 + (uVar7 - (long)source);
    }
    *(int *)((long)LZ4_stream + uVar14 * 4) = (int)plVar18 - iVar10;
    plVar19 = plVar18;
    local_a0 = pcVar6;
    if (((pcVar11 < source + -uVar7) || ((long *)(uVar23 + lVar30 + 0xffff) < plVar18)) ||
       (*(int *)(pcVar11 + (long)pBVar17) != (int)*plVar18)) break;
    plVar21 = (long *)(pcVar6 + 1);
    *pcVar6 = '\0';
  }
  goto LAB_001070c6;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {   int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}